

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall SQSharedState::~SQSharedState(SQSharedState *this)

{
  RefNode *pRVar1;
  bool bVar2;
  SQTable *pSVar3;
  RefTable *in_RDI;
  SQCollectable_conflict *nx;
  SQCollectable_conflict *t;
  SQUnsignedInteger in_stack_ffffffffffffffc8;
  SQStringTable *in_stack_ffffffffffffffd0;
  RefNode *local_10;
  
  if (in_RDI[9]._numofslots != 0) {
    (*(code *)in_RDI[9]._numofslots)(in_RDI[8]._buckets,0);
    in_RDI[9]._numofslots = 0;
  }
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  (**(code **)(*(long *)&((in_RDI[2]._nodes)->obj).super_SQObject + 0x28))();
  (*(code *)(*in_RDI[2]._buckets)[1].obj.super_SQObject._unVal)();
  (**(code **)(*(long *)&(in_RDI->_nodes->obj).super_SQObject + 0x28))();
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  while (bVar2 = sqvector<SQObjectPtr>::empty((sqvector<SQObjectPtr> *)in_RDI->_freelist),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffd0 =
         (SQStringTable *)sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)in_RDI->_freelist);
    ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
    sqvector<SQObjectPtr>::pop_back((sqvector<SQObjectPtr> *)0x13e1f5);
  }
  (*(code *)(*in_RDI[3]._buckets)[1].obj.super_SQObject._unVal)();
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffffd0);
  RefTable::Finalize(in_RDI);
  pRVar1 = in_RDI[3]._nodes;
  if (pRVar1 != (RefNode *)0x0) {
    (pRVar1->obj).super_SQObject._unVal.pTable =
         (SQTable *)
         ((long)&(((pRVar1->obj).super_SQObject._unVal.pTable)->super_SQDelegable).
                 super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted + 1);
    while (local_10 = pRVar1, local_10 != (RefNode *)0x0) {
      (**(code **)(*(long *)&(local_10->obj).super_SQObject + 0x28))();
      pRVar1 = local_10->next;
      if (pRVar1 != (RefNode *)0x0) {
        (pRVar1->obj).super_SQObject._unVal.pTable =
             (SQTable *)
             ((long)&(((pRVar1->obj).super_SQObject._unVal.pTable)->super_SQDelegable).
                     super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted + 1);
      }
      pSVar3 = (SQTable *)((local_10->obj).super_SQObject._unVal.nInteger + -1);
      (local_10->obj).super_SQObject._unVal.pTable = pSVar3;
      if (pSVar3 == (SQTable *)0x0) {
        (**(code **)(*(long *)&(local_10->obj).super_SQObject + 0x10))();
      }
    }
  }
  while (in_RDI[3]._nodes != (RefNode *)0x0) {
    ((in_RDI[3]._nodes)->obj).super_SQObject._unVal.pTable =
         (SQTable *)
         ((long)&((((in_RDI[3]._nodes)->obj).super_SQObject._unVal.pTable)->super_SQDelegable).
                 super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted + 1);
    (**(code **)(*(long *)&((in_RDI[3]._nodes)->obj).super_SQObject + 0x10))();
  }
  sqvector<SQObjectPtr>::~sqvector((sqvector<SQObjectPtr> *)in_stack_ffffffffffffffd0);
  sq_vm_free(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sqvector<SQObjectPtr>::~sqvector((sqvector<SQObjectPtr> *)in_stack_ffffffffffffffd0);
  sq_vm_free(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sqvector<SQObjectPtr>::~sqvector((sqvector<SQObjectPtr> *)in_stack_ffffffffffffffd0);
  sq_vm_free(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  SQStringTable::~SQStringTable(in_stack_ffffffffffffffd0);
  sq_vm_free(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (in_RDI[9]._slotused != 0) {
    sq_vm_free(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  RefTable::~RefTable((RefTable *)0x13e582);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

SQSharedState::~SQSharedState()
{
    if(_releasehook) { _releasehook(_foreignptr,0); _releasehook = NULL; }
    _constructoridx.Null();
    _table(_registry)->Finalize();
    _table(_consts)->Finalize();
    _table(_metamethodsmap)->Finalize();
    _registry.Null();
    _consts.Null();
    _metamethodsmap.Null();
    while(!_systemstrings->empty()) {
        _systemstrings->back().Null();
        _systemstrings->pop_back();
    }
    _thread(_root_vm)->Finalize();
    _root_vm.Null();
    _table_default_delegate.Null();
    _array_default_delegate.Null();
    _string_default_delegate.Null();
    _number_default_delegate.Null();
    _closure_default_delegate.Null();
    _generator_default_delegate.Null();
    _thread_default_delegate.Null();
    _class_default_delegate.Null();
    _instance_default_delegate.Null();
    _weakref_default_delegate.Null();
    _refs_table.Finalize();
#ifndef NO_GARBAGE_COLLECTOR
    SQCollectable *t = _gc_chain;
    SQCollectable *nx = NULL;
    if(t) {
        t->_uiRef++;
        while(t) {
            t->Finalize();
            nx = t->_next;
            if(nx) nx->_uiRef++;
            if(--t->_uiRef == 0)
                t->Release();
            t = nx;
        }
    }
    assert(_gc_chain==NULL); //just to proove a theory
    while(_gc_chain){
        _gc_chain->_uiRef++;
        _gc_chain->Release();
    }
#endif

    sq_delete(_types,SQObjectPtrVec);
    sq_delete(_systemstrings,SQObjectPtrVec);
    sq_delete(_metamethods,SQObjectPtrVec);
    sq_delete(_stringtable,SQStringTable);
    if(_scratchpad)SQ_FREE(_scratchpad,_scratchpadsize);
}